

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O0

IgnorablesMatcher * __thiscall
icu_63::numparse::impl::IgnorablesMatcher::operator=
          (IgnorablesMatcher *this,IgnorablesMatcher *param_1)

{
  IgnorablesMatcher *param_1_local;
  IgnorablesMatcher *this_local;
  
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  return this;
}

Assistant:

class U_I18N_API IgnorablesMatcher : public SymbolMatcher {
  public:
    IgnorablesMatcher() = default;  // WARNING: Leaves the object in an unusable state

    IgnorablesMatcher(unisets::Key key);

    bool isFlexible() const override;

    UnicodeString toString() const override;

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;
}